

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

size_t __thiscall OpenMesh::PropertyT<unsigned_short>::size_of(PropertyT<unsigned_short> *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_iterator cVar2;
  const_iterator cVar3;
  PropertyT<unsigned_short> *this_local;
  
  iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])();
  if (CONCAT44(extraout_var,iVar1) == -1) {
    cVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&this->data_);
    cVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->data_);
    this_local = (PropertyT<unsigned_short> *)
                 std::
                 accumulate<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,unsigned_long,OpenMesh::PropertyT<unsigned_short>::plus>
                           (cVar2._M_current,cVar3._M_current,0);
  }
  else {
    iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])();
    this_local = (PropertyT<unsigned_short> *)
                 BaseProperty::size_of(&this->super_BaseProperty,CONCAT44(extraout_var_00,iVar1));
  }
  return (size_t)this_local;
}

Assistant:

virtual size_t size_of(void) const
  {
    if (element_size() != IO::UnknownSize)
      return this->BaseProperty::size_of(n_elements());
    return std::accumulate(data_.begin(), data_.end(), size_t(0), plus());
  }